

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.cpp
# Opt level: O2

StructDefinition * __thiscall adios2::core::IO::DefineStruct(IO *this,string *name,size_t size)

{
  ADIOS *pAVar1;
  iterator iVar2;
  StructDefinition local_60;
  
  pAVar1 = this->m_ADIOS;
  StructDefinition::StructDefinition(&local_60,name,size);
  iVar2 = std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,adios2::core::StructDefinition>,std::allocator<std::pair<std::__cxx11::string_const,adios2::core::StructDefinition>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
          ::_M_emplace<std::__cxx11::string_const&,adios2::core::StructDefinition>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,adios2::core::StructDefinition>,std::allocator<std::pair<std::__cxx11::string_const,adios2::core::StructDefinition>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
                      *)&pAVar1->m_StructDefinitions,name,&local_60);
  StructDefinition::~StructDefinition(&local_60);
  return (StructDefinition *)
         ((long)iVar2.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::StructDefinition>,_true>
                ._M_cur + 0x28);
}

Assistant:

StructDefinition &IO::DefineStruct(const std::string &name, const size_t size)
{
    return m_ADIOS.m_StructDefinitions.emplace(name, StructDefinition(name, size))->second;
}